

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

short filter_run_buf(filter *f,short *in,float *out,int step,int len)

{
  short sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  
  iVar6 = f->pointer;
  uVar4 = 0;
  uVar5 = (ulong)(uint)len;
  if (len < 1) {
    uVar5 = uVar4;
  }
  iVar3 = 0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    sVar1 = *in;
    f->buffer[iVar6] = (float)(int)sVar1;
    iVar2 = (int)sVar1;
    if (sVar1 <= (short)iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    iVar2 = f->length;
    fVar7 = filter_mac(f->buffer + (iVar6 - iVar2),f->taps,iVar2);
    out[uVar4] = fVar7;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x400) {
      memcpy(f->buffer,&f->pointer + -(long)iVar2,(long)iVar2 * 4);
      iVar6 = iVar2;
    }
    in = in + step;
  }
  f->pointer = iVar6;
  return (short)iVar3;
}

Assistant:

short filter_run_buf(struct filter *f, short *in, float *out, int step, int len)
{
	int id = 0;
	int od = 0;
	short maxval = 0;
	int pointer = f->pointer;
	float *buffer = f->buffer;
	
	while (od < len) {
	        buffer[pointer] = in[id];
		
		// look for peak volume
		if (in[id] > maxval)
			maxval = in[id];
		
		#ifndef __HAVE_ARCH_MAC	
		out[od] = filter_mac(&buffer[pointer - f->length], f->taps, f->length);
		#else
		out[od] = mac(&buffer[pointer - f->length], f->taps, f->length);
		#endif
		pointer++;
		
		/* the buffer is much smaller than the incoming chunks */
		if (pointer == BufferLen) {
			memcpy(buffer, 
			       buffer + BufferLen - f->length,
			       f->length * sizeof(float));
			pointer = f->length;
		}
		
		id += step;
		od++;
	}
	
	f->pointer = pointer;
	
	return maxval;
}